

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O3

void av1_first_pass_row(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,int unit_row,
                       BLOCK_SIZE fp_block_size)

{
  undefined1 *puVar1;
  buf_2d *pbVar2;
  uint8_t uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  _Bool _Var7;
  uint8_t uVar8;
  byte bVar9;
  byte bVar10;
  aom_bit_depth_t aVar11;
  SequenceHeader *pSVar12;
  YV12_BUFFER_CONFIG *src;
  byte *input;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  uint uVar17;
  MV MVar18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [14];
  undefined1 auVar23 [16];
  BLOCK_SIZE BVar24;
  short sVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  FULLPEL_MV FVar29;
  long lVar30;
  RefCntBuffer *pRVar31;
  tran_low_t **pptVar32;
  MB_MODE_INFO **ppMVar33;
  _func_void_uint16_t_ptr_ptrdiff_t_uint16_t_ptr_ptrdiff_t_int_int **pp_Var34;
  int64_t iVar35;
  ulong uVar36;
  int mi_row;
  uint uVar37;
  ulong uVar38;
  uint16_t *puVar39;
  SequenceHeader *pSVar40;
  int iVar41;
  FULLPEL_MV FVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  uint16_t *puVar46;
  byte bVar47;
  int iVar48;
  uint mi_row_00;
  undefined7 in_register_00000081;
  MB_MODE_INFO *pMVar49;
  bool bVar50;
  byte bVar51;
  int iVar52;
  FRAME_STATS *pFVar53;
  int iVar54;
  int iVar55;
  double dVar56;
  ushort uVar57;
  short sVar58;
  short sVar64;
  short sVar65;
  double dVar59;
  short sVar67;
  undefined1 auVar60 [16];
  short sVar66;
  undefined1 auVar61 [16];
  FULLPEL_MV tmp_mv;
  MV local_174;
  int motion_error;
  FULLPEL_MV mv;
  long local_158;
  int tmp_err;
  SequenceHeader *local_138;
  long local_130;
  buf_2d *local_128;
  TileDataEnc *local_120;
  uint local_118;
  uint local_114;
  int local_110;
  uint local_10c;
  int local_108;
  MV local_104;
  YV12_BUFFER_CONFIG *local_100;
  YV12_BUFFER_CONFIG *local_f8;
  ulong local_f0;
  undefined1 local_e8 [16];
  MACROBLOCKD *local_d8;
  RefCntBuffer *local_d0;
  buf_2d *local_c8;
  uint local_c0;
  uint local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  uint local_a8;
  int local_a4;
  ulong local_a0;
  ulong local_98;
  AV1_COMMON *local_90;
  ulong local_88;
  long local_80;
  AV1EncRowMultiThreadSync *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  int *local_58;
  buf_2d unscaled_last_source_buf_2d;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  
  pSVar12 = (cpi->common).seq_params;
  uVar3 = pSVar12->monochrome;
  iVar26 = av1_find_qindex(10.0,pSVar12->bit_depth,0,0xff);
  uVar36 = CONCAT71(in_register_00000081,fp_block_size) & 0xffffffff;
  local_98 = (ulong)block_size_high[uVar36];
  bVar4 = block_size_wide[uVar36];
  bVar5 = ""[uVar36];
  bVar6 = ""[uVar36];
  local_118 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [uVar36];
  iVar41 = ((cpi->common).mi_params.mb_cols << 2) / (int)local_118;
  uVar37 = (tile_data->tile_info).mi_col_start;
  iVar55 = (tile_data->tile_info).mi_row_start >> (bVar6 & 0x1f);
  local_a0 = (ulong)(uint)((int)uVar37 >> (bVar5 & 0x1f));
  local_114 = (int)(~uVar37 + (1 << (bVar5 & 0x1f)) + (tile_data->tile_info).mi_col_end) >>
              (bVar5 & 0x1f);
  local_120 = tile_data;
  local_100 = av1_get_scaled_ref_frame(cpi,1);
  if (local_100 == (YV12_BUFFER_CONFIG *)0x0) {
    lVar30 = (long)(cpi->common).remapped_ref_idx[0];
    if (lVar30 == -1) {
      pRVar31 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar31 = (cpi->common).ref_frame_map[lVar30];
    }
    local_100 = &pRVar31->buf;
    if (pRVar31 == (RefCntBuffer *)0x0) {
      local_100 = (YV12_BUFFER_CONFIG *)0x0;
    }
  }
  iVar54 = (uint)(uVar3 == '\0') * 2 + 1;
  local_f8 = av1_get_scaled_ref_frame(cpi,4);
  if (local_f8 == (YV12_BUFFER_CONFIG *)0x0) {
    lVar30 = (long)(cpi->common).remapped_ref_idx[3];
    if (lVar30 == -1) {
      pRVar31 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar31 = (cpi->common).ref_frame_map[lVar30];
    }
    local_f8 = &pRVar31->buf;
    if (pRVar31 == (RefCntBuffer *)0x0) {
      local_f8 = (YV12_BUFFER_CONFIG *)0x0;
    }
  }
  local_90 = &cpi->common;
  local_108 = unit_row - iVar55;
  local_78 = &local_120->row_mt_sync;
  local_d0 = (cpi->common).cur_frame;
  pFVar53 = (cpi->firstpass_data).mb_stats;
  local_128 = (buf_2d *)(long)(iVar41 * unit_row);
  iVar41 = (int)local_a0;
  lVar30 = (long)(int)local_a0;
  local_58 = (cpi->firstpass_data).raw_motion_err_list + (long)local_128 + lVar30;
  pptVar32 = td->firstpass_ctx->coeff;
  uVar38 = 0;
  do {
    *(tran_low_t **)((long)&(td->mb).plane[0].coeff + uVar38) = *pptVar32;
    *(tran_low_t **)((long)&(td->mb).plane[0].qcoeff + uVar38) = pptVar32[3];
    *(tran_low_t **)((long)&(td->mb).plane[0].eobs + uVar38) = pptVar32[9];
    *(tran_low_t **)((long)&(td->mb).plane[0].txb_entropy_ctx + uVar38) = pptVar32[0xc];
    *(tran_low_t **)((long)&(td->mb).plane[0].dqcoeff + uVar38) = pptVar32[6];
    pptVar32 = pptVar32 + 1;
    uVar38 = uVar38 + 0x88;
  } while ((uint)(iVar54 * 0x88) != uVar38);
  src = cpi->source;
  iVar44 = (src->field_4).field_0.y_stride;
  local_130 = CONCAT44(local_130._4_4_,(local_d0->buf).field_4.field_0.y_stride);
  iVar43 = (local_d0->buf).field_4.field_0.uv_stride;
  local_f0 = CONCAT44(local_f0._4_4_,(local_d0->buf).field_1.field_0.y_height);
  local_138 = (SequenceHeader *)CONCAT44(local_138._4_4_,(local_d0->buf).field_1.field_0.uv_height);
  (td->mb).e_mbd.up_available = unit_row != iVar55;
  mi_row = unit_row << (bVar6 & 0x1f);
  iVar55 = (cpi->oxcf).border_in_pixels;
  iVar48 = 8 - (iVar55 + mi_row * 4);
  iVar52 = (mi_row + (uint)(bVar4 >> 2)) * -4 + -8;
  if (iVar52 < iVar48) {
    iVar52 = iVar48;
  }
  iVar48 = (cpi->common).mi_params.mi_rows;
  (td->mb).mv_limits.row_min = iVar52;
  iVar48 = iVar48 - mi_row;
  iVar52 = iVar55 + (iVar48 - (uint)(bVar4 >> 2)) * 4 + -8;
  iVar55 = iVar48 * 4 + 8;
  if (iVar52 < iVar55) {
    iVar55 = iVar52;
  }
  (td->mb).mv_limits.row_max = iVar55;
  local_10c = (uint)CONCAT71(in_register_00000081,fp_block_size) & 0xff;
  av1_setup_src_planes(&td->mb,src,mi_row,(local_120->tile_info).mi_col_start,iVar54,fp_block_size);
  memset((td->mb).plane[0].src_diff,0,0x200);
  if (0 < (int)local_114) {
    uVar37 = (uint)(bVar4 >> ((int)local_138 < (int)local_f0));
    local_88 = (ulong)uVar37;
    pFVar53 = pFVar53 + (long)local_128 + lVar30;
    iVar54 = iVar41 * (int)local_98;
    iVar55 = (uint)bVar4 * unit_row * (int)local_130;
    local_d8 = &(td->mb).e_mbd;
    mi_row_00 = local_118 * unit_row;
    local_a4 = mi_row_00 * -0x20;
    local_a8 = (uint)(iVar26 == 0);
    local_c0 = (uint)((byte)((local_98 & 0xffffffff) >> 3) & 0x1f);
    local_60 = 0x14fe80L >> ((byte)uVar36 & 0x3f);
    local_68 = 0x28ff00L >> ((byte)uVar36 & 0x3f);
    local_b8 = 2 - (uint)bVar6;
    local_b4 = 2 - (uint)bVar5;
    local_70 = (ulong)(bVar4 >> 2);
    local_130 = (long)(int)((iVar43 * unit_row + iVar41) * uVar37);
    local_80 = (long)(int)(iVar44 * (uint)bVar4 * unit_row + iVar54);
    local_158 = (long)(iVar55 + iVar54);
    local_e8 = ZEXT816(0);
    local_bc = mi_row_00 - 1;
    local_128 = &(td->mb).plane[0].src;
    local_c8 = (td->mb).e_mbd.plane[0].pre;
    local_110 = 0;
    uVar37 = 0 >> (bVar6 & 0x1f);
    do {
      (*(cpi->mt_info).enc_row_mt.sync_read_ptr)(local_78,local_108,uVar37);
      if (1 < (cpi->ppi->p_mt_info).num_workers) {
        pthread_mutex_lock((pthread_mutex_t *)(cpi->mt_info).enc_row_mt.mutex_);
        _Var7 = (cpi->mt_info).enc_row_mt.firstpass_mt_exit;
        pthread_mutex_unlock((pthread_mutex_t *)(cpi->mt_info).enc_row_mt.mutex_);
        if (_Var7 != false) {
          return;
        }
      }
      if (uVar37 == 0) {
        local_174 = local_120->firstpass_top_mv;
      }
      iVar41 = uVar37 + (int)local_a0;
      local_138 = (cpi->common).seq_params;
      uVar8 = local_138->monochrome;
      local_f0 = (ulong)uVar37;
      BVar24 = get_bsize((CommonModeInfoParams *)(ulong)(uint)(cpi->common).mi_params.mi_rows,
                         (BLOCK_SIZE)(cpi->common).mi_params.mi_cols,local_10c,unit_row);
      pSVar12 = local_138;
      uVar37 = iVar41 * local_118;
      iVar26 = (cpi->common).mi_params.mi_stride;
      iVar55 = iVar26 * mi_row_00 + uVar37;
      (cpi->common).mi_params.mi_grid_base[iVar55] =
           (cpi->common).mi_params.mi_alloc +
           (((int)mi_row_00 /
            (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [(cpi->common).mi_params.mi_alloc_bsize]) *
            (cpi->common).mi_params.mi_alloc_stride +
           (int)uVar37 /
           (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [(cpi->common).mi_params.mi_alloc_bsize]);
      ppMVar33 = (cpi->common).mi_params.mi_grid_base + iVar55;
      (td->mb).e_mbd.mi = ppMVar33;
      (td->mb).e_mbd.tx_type_map = (cpi->common).mi_params.tx_type_map + iVar55;
      (td->mb).e_mbd.tx_type_map_stride = iVar26;
      (td->mb).e_mbd.plane[0].dst.buf = (local_d0->buf).field_5.buffers[0] + local_158;
      if (uVar8 == '\0') {
        (td->mb).e_mbd.plane[1].dst.buf = (local_d0->buf).field_5.buffers[1] + local_130;
        (td->mb).e_mbd.plane[2].dst.buf = (local_d0->buf).field_5.buffers[2] + local_130;
      }
      pMVar49 = *ppMVar33;
      pMVar49->bsize = BVar24;
      pMVar49->ref_frame[0] = '\0';
      uVar36 = (ulong)BVar24;
      bVar9 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar36];
      bVar10 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar36];
      iVar26 = (cpi->common).mi_params.mi_rows;
      iVar55 = (cpi->common).mi_params.mi_cols;
      iVar54 = (local_120->tile_info).mi_row_start;
      iVar44 = (local_120->tile_info).mi_col_start;
      (td->mb).e_mbd.mb_to_top_edge = local_a4;
      (td->mb).e_mbd.mb_to_bottom_edge = ((iVar26 - mi_row_00) - (uint)bVar9) * 0x20;
      (td->mb).e_mbd.mb_to_left_edge = uVar37 * -0x20;
      (td->mb).e_mbd.mb_to_right_edge = (iVar55 - (uVar37 + bVar10)) * 0x20;
      (td->mb).e_mbd.mi_row = mi_row_00;
      (td->mb).e_mbd.mi_col = uVar37;
      (td->mb).e_mbd.left_available = iVar44 < (int)uVar37;
      (td->mb).e_mbd.up_available = iVar54 < (int)mi_row_00;
      uVar27 = (td->mb).e_mbd.plane[1].subsampling_x;
      uVar28 = (td->mb).e_mbd.plane[1].subsampling_y;
      (td->mb).e_mbd.chroma_up_available = iVar54 < (int)mi_row_00;
      bVar50 = iVar44 < (int)(uVar37 - 1);
      if (uVar27 == 0) {
        bVar50 = iVar44 < (int)uVar37;
      }
      if ((0x3efffcUL >> (uVar36 & 0x3f) & 1) != 0) {
        bVar50 = iVar44 < (int)uVar37;
      }
      (td->mb).e_mbd.chroma_left_available = bVar50;
      uVar17 = mi_row_00;
      if ((0x20005UL >> (uVar36 & 0x3f) & 1) != 0 && uVar28 != 0) {
        (td->mb).e_mbd.chroma_up_available = iVar54 < (int)local_bc;
        uVar17 = local_bc;
      }
      if (iVar54 < (int)mi_row_00) {
        pMVar49 = (td->mb).e_mbd.mi[-(long)(td->mb).e_mbd.mi_stride];
      }
      else {
        pMVar49 = (MB_MODE_INFO *)0x0;
      }
      (td->mb).e_mbd.above_mbmi = pMVar49;
      if (iVar44 < (int)uVar37) {
        pMVar49 = (td->mb).e_mbd.mi[-1];
      }
      else {
        pMVar49 = (MB_MODE_INFO *)0x0;
      }
      (td->mb).e_mbd.left_mbmi = pMVar49;
      if (((mi_row_00 & 1) == 0) && ((bVar9 & uVar28 != 0) != 0)) {
        (td->mb).e_mbd.is_chroma_ref = false;
      }
      else {
        if (((uVar37 & 1) == 0) && ((bVar10 & 1) != 0)) {
          (td->mb).e_mbd.is_chroma_ref = uVar27 == 0;
          if (uVar27 != 0) goto LAB_001c802e;
        }
        else {
          (td->mb).e_mbd.is_chroma_ref = true;
        }
        iVar26 = (td->mb).e_mbd.mi_stride;
        iVar55 = (uVar27 & uVar37) + (uVar28 & mi_row_00) * iVar26;
        ppMVar33 = (td->mb).e_mbd.mi;
        if (iVar54 < (int)uVar17) {
          pMVar49 = ppMVar33[(long)-iVar55 + (long)(int)(uVar27 - iVar26)];
        }
        else {
          pMVar49 = (MB_MODE_INFO *)0x0;
        }
        (td->mb).e_mbd.chroma_above_mbmi = pMVar49;
        if (bVar50 == false) {
          pMVar49 = (MB_MODE_INFO *)0x0;
        }
        else {
          pMVar49 = ppMVar33[(long)-iVar55 + (long)(int)(iVar26 * uVar28) + -1];
        }
        (td->mb).e_mbd.chroma_left_mbmi = pMVar49;
      }
LAB_001c802e:
      (td->mb).e_mbd.height = bVar9;
      (td->mb).e_mbd.width = bVar10;
      (td->mb).e_mbd.is_last_vertical_rect = false;
      if ((bVar10 < bVar9) && ((uVar37 + bVar10 & bVar9 - 1) == 0)) {
        (td->mb).e_mbd.is_last_vertical_rect = true;
      }
      (td->mb).e_mbd.is_first_horizontal_rect = false;
      if ((bVar9 < bVar10) && ((bVar10 - 1 & mi_row_00) == 0)) {
        (td->mb).e_mbd.is_first_horizontal_rect = true;
      }
      lVar30 = 0xa30;
      if (uVar8 == '\0') {
        lVar30 = 0x1e90;
      }
      lVar45 = 0;
      do {
        bVar47 = (byte)(((uint)bVar9 << 2) >>
                       (*(byte *)((long)(td->mb).e_mbd.plane[0].pre + lVar45 + -0x28) & 0x1f));
        bVar51 = (byte)(((uint)bVar10 << 2) >>
                       (*(byte *)((long)(td->mb).e_mbd.plane[0].pre + lVar45 + -0x2c) & 0x1f));
        if (bVar51 < 5) {
          bVar51 = 4;
        }
        *(byte *)((long)((td->mb).e_mbd.plane[0].seg_iqmatrix + -1) + lVar45 + 0x90) = bVar51;
        if (bVar47 < 5) {
          bVar47 = 4;
        }
        *(byte *)((long)((td->mb).e_mbd.plane[0].seg_iqmatrix + -1) + lVar45 + 0x91) = bVar47;
        lVar45 = lVar45 + 0xa30;
      } while (lVar30 != lVar45);
      puVar1 = &(*(td->mb).e_mbd.mi)->field_0xa7;
      *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfff8;
      pMVar49 = *(td->mb).e_mbd.mi;
      (td->mb).e_mbd.lossless[*(ushort *)&pMVar49->field_0xa7 & 7] = local_a8;
      pMVar49->mode = '\0';
      pMVar49->tx_size = '\0';
      if ((cpi->sf).fp_sf.disable_recon == 0) {
        av1_encode_intra_block_plane(cpi,&td->mb,BVar24,0,'\x01','\0');
      }
      else {
        iVar26 = (td->mb).e_mbd.plane[0].dst.stride;
        puVar46 = (uint16_t *)(td->mb).plane[0].src.buf;
        puVar39 = (uint16_t *)(td->mb).e_mbd.plane[0].dst.buf;
        iVar55 = (td->mb).plane[0].src.stride;
        unscaled_last_source_buf_2d.buf = (uint8_t *)local_138;
        unscaled_last_source_buf_2d.buf0 = (uint8_t *)td;
        av1_foreach_transformed_block_in_plane
                  (local_d8,av1_ss_size_lookup[uVar36][(td->mb).e_mbd.plane[0].subsampling_x]
                            [(td->mb).e_mbd.plane[0].subsampling_y],0,
                   first_pass_intra_pred_and_calc_diff,&unscaled_last_source_buf_2d);
        if (pSVar12->use_highbitdepth == '\0') {
          pp_Var34 = (_func_void_uint16_t_ptr_ptrdiff_t_uint16_t_ptr_ptrdiff_t_int_int **)
                     &aom_convolve_copy;
        }
        else {
          puVar46 = (uint16_t *)((long)puVar46 * 2);
          puVar39 = (uint16_t *)((long)puVar39 * 2);
          pp_Var34 = &aom_highbd_convolve_copy;
        }
        (**pp_Var34)(puVar46,(long)iVar55,puVar39,(long)iVar26,(int)block_size_wide[uVar36],
                     (int)block_size_high[uVar36]);
      }
      uVar27 = aom_get_mb_ss_sse2((td->mb).plane[0].src_diff);
      pSVar12 = local_138;
      if ((local_138->use_highbitdepth == '\0') ||
         (aVar11 = local_138->bit_depth, aVar11 == AOM_BITS_8)) {
LAB_001c825a:
        if ((int)uVar27 < 0x32) {
          pFVar53->intra_skip_count = pFVar53->intra_skip_count + 1;
        }
        else if ((0 < iVar41) && (pFVar53->image_data_start_row == -1)) {
          pFVar53->image_data_start_row = unit_row;
        }
        dVar56 = log1p((double)(int)uVar27);
        if (10.0 <= dVar56) {
          dVar59 = pFVar53->intra_factor + 1.0;
        }
        else {
          dVar59 = (10.0 - dVar56) * 0.05 + 1.0 + pFVar53->intra_factor;
        }
        pFVar53->intra_factor = dVar59;
        input = local_128->buf;
        if (pSVar12->use_highbitdepth == '\0') {
          uVar28 = (uint)*input;
        }
        else {
          uVar57 = *(ushort *)((long)input * 2);
          uVar28 = (uint)uVar57;
          aVar11 = pSVar12->bit_depth;
          if (aVar11 != AOM_BITS_8) {
            if (aVar11 == AOM_BITS_12) {
              uVar28 = (uint)(uVar57 >> 4);
            }
            else {
              pSVar40 = (SequenceHeader *)0xffffffff;
              if (aVar11 != AOM_BITS_10) goto LAB_001c83b7;
              uVar28 = (uint)(uVar57 >> 2);
            }
          }
        }
        if ((9.0 <= dVar56) || (0x3f < uVar28)) {
          dVar56 = pFVar53->brightness_factor + 1.0;
        }
        else {
          dVar56 = (double)(int)(0x40 - uVar28) * 0.01 + 1.0 + pFVar53->brightness_factor;
        }
        pFVar53->brightness_factor = dVar56;
        pFVar53->intra_error = (long)(int)uVar27 + pFVar53->intra_error + 0x400;
        if ((cpi->oxcf).q_cfg.deltaq_mode == '\x02') {
          iVar35 = av1_haar_ac_sad_mxn_uint8_input
                             (input,(td->mb).plane[0].src.stride,
                              (uint)((td->mb).e_mbd.cur_buf)->flags >> 3 & 1,local_c0,
                              (uint)(bVar4 >> 3));
          pFVar53->frame_avg_wavelet_energy = pFVar53->frame_avg_wavelet_energy + iVar35;
        }
        else {
          pFVar53->frame_avg_wavelet_energy = -1;
        }
        pSVar40 = (SequenceHeader *)(ulong)(uVar27 + 0x400);
      }
      else {
        if (aVar11 == AOM_BITS_12) {
          uVar27 = (int)uVar27 >> 8;
          goto LAB_001c825a;
        }
        pSVar40 = (SequenceHeader *)0xffffffff;
        if (aVar11 == AOM_BITS_10) {
          uVar27 = (int)uVar27 >> 4;
          goto LAB_001c825a;
        }
      }
LAB_001c83b7:
      auVar60 = local_e8;
      if (((local_90->current_frame).frame_type & 0xfd) == 0) {
        iVar26 = (int)pSVar40;
        auVar60._0_8_ = (long)iVar26;
        auVar60._8_4_ = iVar26;
        auVar60._12_4_ = iVar26 >> 0x1f;
        pFVar53->coded_error = auVar60._0_8_ + pFVar53->coded_error;
        pFVar53->sr_coded_error = auVar60._8_8_ + pFVar53->sr_coded_error;
      }
      else {
        local_104.row = local_e8._0_2_;
        local_104.col = local_e8._2_2_;
        uVar27 = (uint)((td->mb).e_mbd.cur_buf)->flags >> 3 & 1;
        iVar26 = (td->mb).e_mbd.bd;
        iVar55 = (cpi->common).mi_params.mi_cols;
        local_138 = pSVar40;
        local_e8 = auVar60;
        BVar24 = get_bsize((CommonModeInfoParams *)(ulong)(uint)(cpi->common).mi_params.mi_rows,
                           (BLOCK_SIZE)iVar55,local_10c,unit_row);
        pbVar2 = local_128;
        iVar54 = (cpi->common).mi_params.mb_rows;
        iVar44 = (cpi->common).mi_params.mb_cols;
        local_b0 = iVar54 << ((byte)local_b8 & 0x1f);
        if ((local_60 & 1) != 0) {
          local_b0 = iVar54 >> (bVar6 - 2 & 0x1f);
        }
        local_ac = iVar44 << ((byte)local_b4 & 0x1f);
        if ((local_68 & 1) != 0) {
          local_ac = iVar44 >> (bVar5 - 2 & 0x1f);
        }
        mv.row = 0;
        mv.col = 0;
        (td->mb).e_mbd.plane[0].pre[0].buf = (local_100->field_5).buffers[0] + local_158;
        iVar54 = (cpi->oxcf).border_in_pixels;
        iVar43 = 8 - (iVar54 + uVar37 * 4);
        iVar44 = (uVar37 + (int)local_70) * -4 + -8;
        if (iVar44 < iVar43) {
          iVar44 = iVar43;
        }
        (td->mb).mv_limits.col_min = iVar44;
        iVar55 = iVar55 - uVar37;
        iVar54 = iVar54 + (iVar55 - (int)local_70) * 4 + -8;
        iVar55 = iVar55 * 4 + 8;
        if (iVar54 < iVar55) {
          iVar55 = iVar54;
        }
        (td->mb).mv_limits.col_max = iVar55;
        motion_error = get_prediction_error_bitdepth(uVar27,iVar26,BVar24,local_128,local_c8);
        unscaled_last_source_buf_2d.buf = (cpi->unscaled_last_source->field_5).buffers[0] + local_80
        ;
        unscaled_last_source_buf_2d.stride = (cpi->unscaled_last_source->field_4).field_0.y_stride;
        local_e8._0_4_ = iVar26;
        iVar26 = get_prediction_error_bitdepth
                           (uVar27,iVar26,BVar24,pbVar2,&unscaled_last_source_buf_2d);
        local_58[local_110] = iVar26;
        if ((((cpi->sf).fp_sf.skip_motion_search_threshold < iVar26) &&
            (first_pass_motion_search(cpi,&td->mb,&local_104,&mv,&motion_error),
            (cpi->sf).fp_sf.skip_zeromv_motion_search == 0)) && (local_104 != (MV)0x0)) {
          tmp_mv.row = 0;
          tmp_mv.col = 0;
          tmp_err = 0x7fffffff;
          first_pass_motion_search(cpi,&td->mb,&kZeroMv,&tmp_mv,&tmp_err);
          if (tmp_err < motion_error) {
            motion_error = tmp_err;
            mv = tmp_mv;
          }
        }
        iVar26 = motion_error;
        FVar42 = SUB84(local_138,0);
        FVar29 = (FULLPEL_MV)motion_error;
        if ((local_f8 != (YV12_BUFFER_CONFIG *)0x0) &&
           (1 < (cpi->common).current_frame.frame_number)) {
          av1_setup_pre_planes(local_d8,0,local_f8,0,0,(scale_factors *)0x0,1);
          pbVar2 = (td->mb).e_mbd.plane[0].pre;
          pbVar2->buf = pbVar2->buf + local_158;
          tmp_mv = (FULLPEL_MV)
                   get_prediction_error_bitdepth(uVar27,local_e8._0_4_,BVar24,local_128,local_c8);
          first_pass_motion_search(cpi,&td->mb,&kZeroMv,(FULLPEL_MV *)&tmp_err,(int *)&tmp_mv);
          FVar29 = tmp_mv;
          if (((int)tmp_mv < iVar26) && ((int)tmp_mv < (int)FVar42)) {
            pFVar53->second_ref_count = pFVar53->second_ref_count + 1;
          }
        }
        if ((int)FVar42 <= (int)FVar29) {
          FVar29 = FVar42;
        }
        if ((cpi->common).current_frame.frame_number < 2) {
          FVar29 = (FULLPEL_MV)iVar26;
        }
        if (local_f8 == (YV12_BUFFER_CONFIG *)0x0) {
          FVar29 = (FULLPEL_MV)iVar26;
        }
        pFVar53->sr_coded_error = pFVar53->sr_coded_error + (long)(int)FVar29;
        local_c8->buf = (local_100->field_5).buffers[0] + local_158;
        if (((cpi->common).seq_params)->monochrome == '\0') {
          (td->mb).e_mbd.plane[1].pre[0].buf = (local_100->field_5).buffers[1] + local_130;
          (td->mb).e_mbd.plane[2].pre[0].buf = (local_100->field_5).buffers[2] + local_130;
        }
        local_e8 = (undefined1  [16])0x0;
        if (iVar26 <= (int)FVar42) {
          if (((int)FVar42 < 0x800) && ((int)FVar42 * 9 + -0x2400 <= iVar26 * 10)) {
            dVar56 = pFVar53->neutral_count + 1.0;
LAB_001c87db:
            pFVar53->neutral_count = dVar56;
          }
          else if ((0x2000 < (int)FVar42) && ((int)FVar42 < iVar26 * 3)) {
            dVar56 = (double)iVar26 / ((double)(int)FVar42 + 1e-06) + pFVar53->neutral_count;
            goto LAB_001c87db;
          }
          local_e8 = psllw(ZEXT416((uint)mv),3);
          MVar18 = local_e8._0_4_;
          pMVar49 = *(td->mb).e_mbd.mi;
          pMVar49->mode = '\x10';
          pMVar49->mv[0].as_int = (uint32_t)MVar18;
          pMVar49 = *(td->mb).e_mbd.mi;
          pMVar49->tx_size = '\0';
          pMVar49->ref_frame[0] = '\x01';
          (*(td->mb).e_mbd.mi)->ref_frame[1] = -1;
          if ((cpi->sf).fp_sf.disable_recon == 0) {
            av1_enc_build_inter_predictor
                      (local_90,local_d8,mi_row_00,uVar37,(BUFFER_SET *)0x0,BVar24,0,0);
            av1_encode_sby_pass1(cpi,&td->mb,BVar24);
          }
          sVar58 = local_e8._0_2_;
          sVar25 = -sVar58;
          sVar64 = local_e8._2_2_;
          sVar13 = -sVar64;
          sVar65 = local_e8._4_2_;
          sVar14 = -sVar65;
          sVar66 = local_e8._6_2_;
          sVar15 = -sVar66;
          sVar67 = local_e8._8_2_;
          sVar16 = -sVar67;
          uVar57 = (ushort)(sVar15 < sVar66) * sVar66 | (ushort)(sVar15 >= sVar66) * sVar15;
          auVar21._2_2_ = (ushort)(sVar16 < sVar67) * sVar67 | (ushort)(sVar16 >= sVar67) * sVar16;
          auVar21._0_2_ = uVar57;
          auVar63._0_12_ = local_e8._0_12_;
          auVar63._12_2_ = sVar66;
          auVar63._14_2_ = sVar66;
          auVar62._12_4_ = auVar63._12_4_;
          auVar62._0_10_ = local_e8._0_10_;
          auVar62._10_2_ = sVar65;
          auVar61._10_6_ = auVar62._10_6_;
          auVar61._0_8_ = local_e8._0_8_;
          auVar61._8_2_ = sVar65;
          auVar19._4_8_ = auVar61._8_8_;
          auVar19._2_2_ = sVar64;
          auVar19._0_2_ = sVar64;
          iVar55 = (int)sVar58;
          iVar54 = auVar19._0_4_ >> 0x10;
          auVar21._4_8_ = 0;
          auVar22._12_2_ = uVar57;
          auVar22._0_12_ = auVar21 << 0x30;
          auVar23._8_8_ = 0;
          auVar23._0_8_ =
               CONCAT44(auVar22._10_4_,
                        CONCAT22((ushort)(sVar14 < sVar65) * sVar65 |
                                 (ushort)(sVar14 >= sVar65) * sVar14,uVar57)) >> 0x10;
          auVar20._2_10_ = SUB1610(auVar23 << 0x40,6);
          auVar20._0_2_ = (ushort)(sVar13 < sVar64) * sVar64 | (ushort)(sVar13 >= sVar64) * sVar13;
          pFVar53->sum_mvr = iVar55 + pFVar53->sum_mvr;
          pFVar53->sum_mvc = iVar54 + pFVar53->sum_mvc;
          pFVar53->sum_mvr_abs =
               (uint)(ushort)((ushort)(sVar25 < sVar58) * sVar58 |
                             (ushort)(sVar25 >= sVar58) * sVar25) + pFVar53->sum_mvr_abs;
          pFVar53->sum_mvc_abs = auVar20._0_4_ + pFVar53->sum_mvc_abs;
          pFVar53->sum_mvrs = pFVar53->sum_mvrs + (ulong)(uint)(iVar55 * iVar55);
          pFVar53->sum_mvcs = pFVar53->sum_mvcs + (ulong)(uint)(iVar54 * iVar54);
          pFVar53->inter_count = pFVar53->inter_count + 1;
          FVar42 = (FULLPEL_MV)iVar26;
          if (MVar18 != (MV)0x0) {
            pFVar53->mv_count = pFVar53->mv_count + 1;
            if (local_174 != MVar18) {
              pFVar53->new_mv_count = pFVar53->new_mv_count + 1;
            }
            sVar25 = mv.row;
            if (unit_row < local_b0 / 2) {
              iVar26 = -1;
              if (sVar25 < 1) {
                if (-1 < sVar25) goto LAB_001c8952;
                iVar26 = 1;
              }
LAB_001c894d:
              pFVar53->sum_in_vectors = pFVar53->sum_in_vectors + iVar26;
            }
            else if (local_b0 / 2 < unit_row) {
              iVar26 = 1;
              if (sVar25 < 1) {
                if (-1 < sVar25) goto LAB_001c8952;
                iVar26 = -1;
              }
              goto LAB_001c894d;
            }
LAB_001c8952:
            iVar26 = (int)mv >> 0x10;
            local_174 = MVar18;
            if (iVar41 < local_ac / 2) {
              iVar41 = -1;
              if (iVar26 < 1) {
                if (-1 < iVar26) goto LAB_001c8994;
                iVar41 = 1;
              }
            }
            else {
              if (iVar41 <= local_ac / 2) goto LAB_001c8994;
              iVar41 = 1;
              if (iVar26 < 1) {
                if (-1 < iVar26) goto LAB_001c8994;
                iVar41 = -1;
              }
            }
            pFVar53->sum_in_vectors = pFVar53->sum_in_vectors + iVar41;
          }
        }
LAB_001c8994:
        if ((int)local_f0 == 0) {
          local_120->firstpass_top_mv = local_174;
        }
        pFVar53->coded_error = pFVar53->coded_error + (long)(int)FVar42;
        local_110 = local_110 + 1;
      }
      uVar27 = local_114;
      local_128->buf = local_128->buf + local_98;
      if (uVar3 == '\0') {
        pbVar2 = &(td->mb).plane[1].src;
        pbVar2->buf = pbVar2->buf + local_88;
        pbVar2 = &(td->mb).plane[2].src;
        pbVar2->buf = pbVar2->buf + local_88;
      }
      local_158 = local_158 + local_98;
      local_80 = local_80 + local_98;
      local_130 = local_130 + local_88;
      pFVar53 = pFVar53 + 1;
      iVar26 = (int)local_f0;
      (*(cpi->mt_info).enc_row_mt.sync_write_ptr)(local_78,local_108,iVar26,local_114);
      uVar37 = iVar26 + 1;
    } while (uVar37 != uVar27);
  }
  return;
}

Assistant:

void av1_first_pass_row(AV1_COMP *cpi, ThreadData *td, TileDataEnc *tile_data,
                        const int unit_row, const BLOCK_SIZE fp_block_size) {
  MACROBLOCK *const x = &td->mb;
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const SequenceHeader *const seq_params = cm->seq_params;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  TileInfo *tile = &tile_data->tile_info;
  const int qindex = find_fp_qindex(seq_params->bit_depth);
  const int fp_block_size_width = block_size_high[fp_block_size];
  const int fp_block_size_height = block_size_wide[fp_block_size];
  const int unit_width = mi_size_wide[fp_block_size];
  const int unit_width_log2 = mi_size_wide_log2[fp_block_size];
  const int unit_height_log2 = mi_size_high_log2[fp_block_size];
  const int unit_cols = mi_params->mb_cols * 4 / unit_width;
  int raw_motion_err_counts = 0;
  int unit_row_in_tile = unit_row - (tile->mi_row_start >> unit_height_log2);
  int unit_col_start = tile->mi_col_start >> unit_width_log2;
  int unit_cols_in_tile = av1_get_unit_cols_in_tile(tile, fp_block_size);
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
  AV1EncRowMultiThreadSync *const row_mt_sync = &tile_data->row_mt_sync;

  const YV12_BUFFER_CONFIG *last_frame =
      av1_get_scaled_ref_frame(cpi, LAST_FRAME);
  if (!last_frame) {
    last_frame = get_ref_frame_yv12_buf(cm, LAST_FRAME);
  }
  const YV12_BUFFER_CONFIG *golden_frame =
      av1_get_scaled_ref_frame(cpi, GOLDEN_FRAME);
  if (!golden_frame) {
    golden_frame = get_ref_frame_yv12_buf(cm, GOLDEN_FRAME);
  }
  YV12_BUFFER_CONFIG *const this_frame = &cm->cur_frame->buf;

  PICK_MODE_CONTEXT *ctx = td->firstpass_ctx;
  FRAME_STATS *mb_stats =
      cpi->firstpass_data.mb_stats + unit_row * unit_cols + unit_col_start;
  int *raw_motion_err_list = cpi->firstpass_data.raw_motion_err_list +
                             unit_row * unit_cols + unit_col_start;
  MV *first_top_mv = &tile_data->firstpass_top_mv;

  for (int i = 0; i < num_planes; ++i) {
    x->plane[i].coeff = ctx->coeff[i];
    x->plane[i].qcoeff = ctx->qcoeff[i];
    x->plane[i].eobs = ctx->eobs[i];
    x->plane[i].txb_entropy_ctx = ctx->txb_entropy_ctx[i];
    x->plane[i].dqcoeff = ctx->dqcoeff[i];
  }

  const int src_y_stride = cpi->source->y_stride;
  const int recon_y_stride = this_frame->y_stride;
  const int recon_uv_stride = this_frame->uv_stride;
  const int uv_mb_height =
      fp_block_size_height >> (this_frame->y_height > this_frame->uv_height);

  MV best_ref_mv = kZeroMv;
  MV last_mv;

  // Reset above block coeffs.
  xd->up_available = (unit_row_in_tile != 0);
  int recon_yoffset = (unit_row * recon_y_stride * fp_block_size_height) +
                      (unit_col_start * fp_block_size_width);
  int src_yoffset = (unit_row * src_y_stride * fp_block_size_height) +
                    (unit_col_start * fp_block_size_width);
  int recon_uvoffset = (unit_row * recon_uv_stride * uv_mb_height) +
                       (unit_col_start * uv_mb_height);

  // Set up limit values for motion vectors to prevent them extending
  // outside the UMV borders.
  av1_set_mv_row_limits(
      mi_params, &x->mv_limits, (unit_row << unit_height_log2),
      (fp_block_size_height >> MI_SIZE_LOG2), cpi->oxcf.border_in_pixels);

  av1_setup_src_planes(x, cpi->source, unit_row << unit_height_log2,
                       tile->mi_col_start, num_planes, fp_block_size);

  // Fix - zero the 16x16 block first. This ensures correct this_intra_error for
  // block sizes smaller than 16x16.
  av1_zero_array(x->plane[0].src_diff, 256);

  for (int unit_col_in_tile = 0; unit_col_in_tile < unit_cols_in_tile;
       unit_col_in_tile++) {
    const int unit_col = unit_col_start + unit_col_in_tile;

    enc_row_mt->sync_read_ptr(row_mt_sync, unit_row_in_tile, unit_col_in_tile);

#if CONFIG_MULTITHREAD
    if (cpi->ppi->p_mt_info.num_workers > 1) {
      pthread_mutex_lock(enc_row_mt->mutex_);
      bool firstpass_mt_exit = enc_row_mt->firstpass_mt_exit;
      pthread_mutex_unlock(enc_row_mt->mutex_);
      // Exit in case any worker has encountered an error.
      if (firstpass_mt_exit) return;
    }
#endif

    if (unit_col_in_tile == 0) {
      last_mv = *first_top_mv;
    }
    int this_intra_error = firstpass_intra_prediction(
        cpi, td, this_frame, tile, unit_row, unit_col, recon_yoffset,
        recon_uvoffset, fp_block_size, qindex, mb_stats);

    if (!frame_is_intra_only(cm)) {
      const int this_inter_error = firstpass_inter_prediction(
          cpi, td, last_frame, golden_frame, unit_row, unit_col, recon_yoffset,
          recon_uvoffset, src_yoffset, fp_block_size, this_intra_error,
          raw_motion_err_counts, raw_motion_err_list, best_ref_mv, &best_ref_mv,
          &last_mv, mb_stats);
      if (unit_col_in_tile == 0) {
        *first_top_mv = last_mv;
      }
      mb_stats->coded_error += this_inter_error;
      ++raw_motion_err_counts;
    } else {
      mb_stats->sr_coded_error += this_intra_error;
      mb_stats->coded_error += this_intra_error;
    }

    // Adjust to the next column of MBs.
    x->plane[0].src.buf += fp_block_size_width;
    if (num_planes > 1) {
      x->plane[1].src.buf += uv_mb_height;
      x->plane[2].src.buf += uv_mb_height;
    }

    recon_yoffset += fp_block_size_width;
    src_yoffset += fp_block_size_width;
    recon_uvoffset += uv_mb_height;
    mb_stats++;

    enc_row_mt->sync_write_ptr(row_mt_sync, unit_row_in_tile, unit_col_in_tile,
                               unit_cols_in_tile);
  }
}